

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

int ec_seckey_import_der(secp256k1_context *ctx,uchar *out32,uchar *seckey,size_t seckeylen)

{
  long lVar1;
  int iVar2;
  secp256k1_context *ctx_00;
  byte *pbVar3;
  uchar *seckey_00;
  char *pcVar4;
  uchar *puVar5;
  ulong __n;
  long in_RCX;
  char *in_RDX;
  void *in_RSI;
  long in_FS_OFFSET;
  ptrdiff_t oslen;
  ptrdiff_t len;
  ptrdiff_t lenb;
  uchar *end;
  uint local_58;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ctx_00 = (secp256k1_context *)(in_RDX + in_RCX);
  memset(in_RSI,0,0x20);
  if (((long)ctx_00 - (long)in_RDX < 1) || (*in_RDX != '0')) {
    local_c = 0;
  }
  else {
    pbVar3 = (byte *)(in_RDX + 1);
    if (((long)ctx_00 - (long)pbVar3 < 1) || ((*pbVar3 & 0x80) == 0)) {
      local_c = 0;
    }
    else {
      seckey_00 = (uchar *)(ulong)(*pbVar3 & 0xffffff7f);
      pcVar4 = in_RDX + 2;
      if ((seckey_00 == (uchar *)0x0) || ((uchar *)0x2 < seckey_00)) {
        local_c = 0;
      }
      else if ((long)ctx_00 - (long)pcVar4 < (long)seckey_00) {
        local_c = 0;
      }
      else {
        if (seckey_00 < (uchar *)0x2) {
          local_58 = 0;
        }
        else {
          local_58 = (uint)(byte)pcVar4[(long)(seckey_00 + -2)] << 8;
        }
        puVar5 = seckey_00 + (long)pcVar4;
        if ((long)ctx_00 - (long)puVar5 <
            (long)(ulong)((byte)pcVar4[(long)(seckey_00 + -1)] | local_58)) {
          local_c = 0;
        }
        else if (((((long)ctx_00 - (long)puVar5 < 3) || (*puVar5 != '\x02')) ||
                 (puVar5[1] != '\x01')) || (puVar5[2] != '\x01')) {
          local_c = 0;
        }
        else if (((long)ctx_00 - (long)(puVar5 + 3) < 2) || (puVar5[3] != '\x04')) {
          local_c = 0;
        }
        else {
          __n = (ulong)puVar5[4];
          if ((__n < 0x21) && ((long)__n <= (long)ctx_00 - (long)(puVar5 + 5))) {
            memcpy((void *)((long)in_RSI + (0x20 - __n)),puVar5 + 5,__n);
            iVar2 = secp256k1_ec_seckey_verify(ctx_00,seckey_00);
            if (iVar2 == 0) {
              memset(in_RSI,0,0x20);
              local_c = 0;
            }
            else {
              local_c = 1;
            }
          }
          else {
            local_c = 0;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

int ec_seckey_import_der(const secp256k1_context* ctx, unsigned char *out32, const unsigned char *seckey, size_t seckeylen) {
    const unsigned char *end = seckey + seckeylen;
    memset(out32, 0, 32);
    /* sequence header */
    if (end - seckey < 1 || *seckey != 0x30u) {
        return 0;
    }
    seckey++;
    /* sequence length constructor */
    if (end - seckey < 1 || !(*seckey & 0x80u)) {
        return 0;
    }
    ptrdiff_t lenb = *seckey & ~0x80u; seckey++;
    if (lenb < 1 || lenb > 2) {
        return 0;
    }
    if (end - seckey < lenb) {
        return 0;
    }
    /* sequence length */
    ptrdiff_t len = seckey[lenb-1] | (lenb > 1 ? seckey[lenb-2] << 8 : 0u);
    seckey += lenb;
    if (end - seckey < len) {
        return 0;
    }
    /* sequence element 0: version number (=1) */
    if (end - seckey < 3 || seckey[0] != 0x02u || seckey[1] != 0x01u || seckey[2] != 0x01u) {
        return 0;
    }
    seckey += 3;
    /* sequence element 1: octet string, up to 32 bytes */
    if (end - seckey < 2 || seckey[0] != 0x04u) {
        return 0;
    }
    ptrdiff_t oslen = seckey[1];
    seckey += 2;
    if (oslen > 32 || end - seckey < oslen) {
        return 0;
    }
    memcpy(out32 + (32 - oslen), seckey, oslen);
    if (!secp256k1_ec_seckey_verify(ctx, out32)) {
        memset(out32, 0, 32);
        return 0;
    }
    return 1;
}